

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O2

void __thiscall
duckdb_parquet::BloomFilterAlgorithm::printTo(BloomFilterAlgorithm *this,ostream *out)

{
  string sStack_38;
  
  std::operator<<(out,"BloomFilterAlgorithm(");
  std::operator<<(out,"BLOCK=");
  if (((byte)this->__isset & 1) == 0) {
    std::operator<<(out,"<null>");
  }
  else {
    duckdb_apache::thrift::to_string<duckdb_parquet::SplitBlockAlgorithm>(&sStack_38,&this->BLOCK);
    std::operator<<(out,(string *)&sStack_38);
    std::__cxx11::string::~string((string *)&sStack_38);
  }
  std::operator<<(out,")");
  return;
}

Assistant:

void BloomFilterAlgorithm::printTo(std::ostream& out) const {
  using ::apache::thrift::to_string;
  out << "BloomFilterAlgorithm(";
  out << "BLOCK="; (__isset.BLOCK ? (out << to_string(BLOCK)) : (out << "<null>"));
  out << ")";
}